

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_column_removal<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
               (void)

{
  Underlying_matrix *this;
  Column_container *pCVar1;
  uint uVar2;
  _Hash_node_base *p_Var3;
  pointer puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  Column_settings *pCVar9;
  Column_settings *pCVar10;
  Column_zp_settings *this_00;
  ulong uVar11;
  uint uVar12;
  pointer witness;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  columns;
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_> m;
  shared_count sStack_330;
  undefined1 local_328 [8];
  pointer ppStack_320;
  _Base_ptr local_318;
  char *local_310;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_2f0;
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_> local_2d8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
            ();
  this_00 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>::
  Column_zp_settings::Column_zp_settings(this_00,5);
  this = &local_2d8.matrix_;
  local_2d8.colSettings_ = this_00;
  Gudhi::persistence_matrix::
  Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
  ::
  Base_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
              *)this,&local_2f0,this_00);
  test_content_equality<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>
            (&local_2f0,&local_2d8);
  local_328._0_4_ = 2;
  if (local_2d8.matrix_.nextInsertIndex_ == 3) {
    local_2d8.matrix_.nextInsertIndex_ = 2;
  }
  pCVar1 = &local_2d8.matrix_.matrix_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&pCVar1->_M_h,local_328);
  local_328._0_4_ = 4;
  if (local_2d8.matrix_.nextInsertIndex_ == 5) {
    local_2d8.matrix_.nextInsertIndex_ = 4;
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase(&pCVar1->_M_h,local_328);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x341);
  if (local_2d8.matrix_.
      super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
      .rowSwapped_ == true) {
    Gudhi::persistence_matrix::
    Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
    ::_orderRows(&this->
                  super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                );
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_2d8.matrix_.matrix_._M_h._M_bucket_count;
  uVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar5,0);
  if (local_2d8.matrix_.matrix_._M_h._M_buckets[uVar11 & 0xffffffff] != (__node_base_ptr)0x0) {
    p_Var3 = local_2d8.matrix_.matrix_._M_h._M_buckets[uVar11 & 0xffffffff]->_M_nxt;
    uVar12 = *(uint *)&p_Var3[1]._M_nxt;
    do {
      if (uVar12 == 2) {
        local_60 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_58 = "";
        local_70 = &boost::unit_test::basic_cstring<char_const>::null;
        local_68 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x341);
        sStack_330.pi_ = (sp_counted_base *)0x0;
        ppStack_320 = (pointer)((ulong)ppStack_320 & 0xffffffffffffff00);
        local_328 = (undefined1  [8])&PTR__lazy_ostream_001bf7f0;
        local_318 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_310 = "exception std::logic_error expected but not raised";
        local_80 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_78 = "";
        boost::test_tools::tt_detail::report_assertion();
        boost::detail::shared_count::~shared_count(&sStack_330);
        local_c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
        ;
        local_b8 = "";
        local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x342);
        if (local_2d8.matrix_.
            super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
            .rowSwapped_ == true) {
          Gudhi::persistence_matrix::
          Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
          ::_orderRows(&this->
                        super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                      );
        }
        auVar6._8_8_ = 0;
        auVar6._0_8_ = local_2d8.matrix_.matrix_._M_h._M_bucket_count;
        uVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar6,0);
        if (local_2d8.matrix_.matrix_._M_h._M_buckets[uVar11 & 0xffffffff] != (__node_base_ptr)0x0)
        {
          p_Var3 = local_2d8.matrix_.matrix_._M_h._M_buckets[uVar11 & 0xffffffff]->_M_nxt;
          uVar12 = *(uint *)&p_Var3[1]._M_nxt;
          do {
            if (uVar12 == 4) {
              local_e0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_d8 = "";
              local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x342);
              sStack_330.pi_ = (sp_counted_base *)0x0;
              ppStack_320 = (pointer)((ulong)ppStack_320 & 0xffffffffffffff00);
              local_328 = (undefined1  [8])&PTR__lazy_ostream_001bf7f0;
              local_318 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
              local_310 = "exception std::logic_error expected but not raised";
              local_100 = 
              "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
              ;
              local_f8 = "";
              boost::test_tools::tt_detail::report_assertion();
              boost::detail::shared_count::~shared_count(&sStack_330);
              std::
              vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ::_M_erase(&local_2f0,
                         local_2f0.
                         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 4);
              std::
              vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              ::_M_erase(&local_2f0,
                         local_2f0.
                         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 2);
              if (local_2f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  local_2f0.
                  super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                uVar12 = 0;
                witness = local_2f0.
                          super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  if ((uVar12 == 4) || (uVar12 == 2)) {
                    uVar12 = uVar12 | 1;
                  }
                  if (local_2d8.matrix_.
                      super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                      .rowSwapped_ == true) {
                    Gudhi::persistence_matrix::
                    Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                    ::_orderRows(&this->
                                  super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                                );
                  }
                  if (local_2d8.matrix_.matrix_._M_h._M_buckets
                      [(ulong)uVar12 % local_2d8.matrix_.matrix_._M_h._M_bucket_count] ==
                      (__node_base_ptr)0x0) {
LAB_00168275:
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var3 = local_2d8.matrix_.matrix_._M_h._M_buckets
                           [(ulong)uVar12 % local_2d8.matrix_.matrix_._M_h._M_bucket_count]->_M_nxt;
                  uVar2 = *(uint *)&p_Var3[1]._M_nxt;
                  while (uVar12 != uVar2) {
                    p_Var3 = p_Var3->_M_nxt;
                    if ((p_Var3 == (_Hash_node_base *)0x0) ||
                       (uVar2 = *(uint *)&p_Var3[1]._M_nxt,
                       (ulong)uVar2 % local_2d8.matrix_.matrix_._M_h._M_bucket_count !=
                       (ulong)uVar12 % local_2d8.matrix_.matrix_._M_h._M_bucket_count))
                    goto LAB_00168275;
                  }
                  get_column_content_via_iterators<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
                            ((column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                              *)local_328,
                             (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>
                              *)(p_Var3 + 2));
                  test_column_equality<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>>>
                            (witness,(column_content<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                                      *)local_328);
                  uVar12 = uVar12 + 1;
                  std::
                  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                               *)local_328);
                  witness = witness + 1;
                } while (witness !=
                         local_2f0.
                         super__Vector_base<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
              }
              local_328 = (undefined1  [8])0x0;
              ppStack_320 = (pointer)0x0;
              local_318 = (_Base_ptr)0x0;
              Gudhi::persistence_matrix::
              Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>::
              insert_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
                        ((Matrix<Base_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true>>
                          *)&local_2d8,
                         (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                          *)local_328,2);
              pCVar1 = &local_2d8.matrix_.matrix_;
              if (local_328 != (undefined1  [8])0x0) {
                operator_delete((void *)local_328,(long)local_318 - (long)local_328);
              }
              if (local_2d8.matrix_.
                  super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                  .rowSwapped_ == true) {
                Gudhi::persistence_matrix::
                Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                ::_orderRows(&this->
                              super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                            );
              }
              auVar7._8_8_ = 0;
              auVar7._0_8_ = local_2d8.matrix_.matrix_._M_h._M_bucket_count;
              uVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(2)) % auVar7,0);
              if (local_2d8.matrix_.matrix_._M_h._M_buckets[uVar11 & 0xffffffff] !=
                  (__node_base_ptr)0x0) {
                p_Var3 = local_2d8.matrix_.matrix_._M_h._M_buckets[uVar11 & 0xffffffff]->_M_nxt;
                uVar12 = *(uint *)&p_Var3[1]._M_nxt;
                do {
                  if (uVar12 == 2) {
                    local_140 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_138 = "";
                    local_150 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,
                               0x34e);
                    sStack_330.pi_ = (sp_counted_base *)0x0;
                    ppStack_320 = (pointer)((ulong)ppStack_320 & 0xffffffffffffff00);
                    local_328 = (undefined1  [8])&PTR__lazy_ostream_001bf9b0;
                    local_318 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
                    local_310 = "no exceptions thrown by m.get_column(2)";
                    local_160 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_158 = "";
                    boost::test_tools::tt_detail::report_assertion();
                    boost::detail::shared_count::~shared_count(&sStack_330);
                    local_1a0 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                    ;
                    local_198 = "";
                    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
                    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
                    boost::unit_test::unit_test_log_t::set_checkpoint
                              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,
                               0x34f);
                    if (local_2d8.matrix_.
                        super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                        .rowSwapped_ == true) {
                      Gudhi::persistence_matrix::
                      Base_swap<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>,_Gudhi::persistence_matrix::Base_matrix<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>
                      ::_orderRows(&this->
                                    super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                                  );
                    }
                    auVar8._8_8_ = 0;
                    auVar8._0_8_ = local_2d8.matrix_.matrix_._M_h._M_bucket_count;
                    uVar11 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(4)) % auVar8,0);
                    if (local_2d8.matrix_.matrix_._M_h._M_buckets[uVar11 & 0xffffffff] !=
                        (__node_base_ptr)0x0) {
                      p_Var3 = local_2d8.matrix_.matrix_._M_h._M_buckets[uVar11 & 0xffffffff]->
                               _M_nxt;
                      uVar12 = *(uint *)&p_Var3[1]._M_nxt;
                      do {
                        if (uVar12 == 4) {
                          local_1c0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_1b8 = "";
                          local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,
                                     &local_1c0,0x34f);
                          sStack_330.pi_ = (sp_counted_base *)0x0;
                          ppStack_320 = (pointer)((ulong)ppStack_320 & 0xffffffffffffff00);
                          local_328 = (undefined1  [8])&PTR__lazy_ostream_001bf7f0;
                          local_318 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
                          local_310 = "exception std::logic_error expected but not raised";
                          local_1e0 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
                          ;
                          local_1d8 = "";
                          boost::test_tools::tt_detail::report_assertion();
                          boost::detail::shared_count::~shared_count(&sStack_330);
                          pCVar9 = local_2d8.colSettings_;
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::clear(&pCVar1->_M_h);
                          pCVar10 = local_2d8.colSettings_;
                          local_2d8.matrix_.nextInsertIndex_ = 0;
                          local_2d8.matrix_.colSettings_ = pCVar9;
                          if (local_2d8.colSettings_ != (Column_zp_settings *)0x0) {
                            boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
                                      ((pool<boost::default_user_allocator_malloc_free> *)
                                       &(local_2d8.colSettings_)->entryConstructor);
                            puVar4 = (pCVar10->operators).inverse_.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                            if (puVar4 != (pointer)0x0) {
                              operator_delete(puVar4,(long)(pCVar10->operators).inverse_.
                                                                                                                      
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)puVar4);
                            }
                          }
                          operator_delete(pCVar10,0x58);
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable(&pCVar1->_M_h);
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable(&local_2d8.matrix_.
                                         super_template_Base_swap_option<Base_matrix<Matrix<Base_options<false,_(Column_types)7,_true,_true>_>_>_>
                                         .rowToIndex_._M_h);
                          std::
                          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                         *)this);
                          std::
                          vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                          ::~vector(&local_2f0);
                          return;
                        }
                        p_Var3 = p_Var3->_M_nxt;
                      } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                              (uVar12 = *(uint *)&p_Var3[1]._M_nxt,
                              (ulong)uVar12 % local_2d8.matrix_.matrix_._M_h._M_bucket_count ==
                              uVar11));
                    }
                    std::__throw_out_of_range("_Map_base::at");
                  }
                  p_Var3 = p_Var3->_M_nxt;
                } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                        (uVar12 = *(uint *)&p_Var3[1]._M_nxt,
                        (ulong)uVar12 % local_2d8.matrix_.matrix_._M_h._M_bucket_count == uVar11));
              }
              std::__throw_out_of_range("_Map_base::at");
            }
            p_Var3 = p_Var3->_M_nxt;
          } while ((p_Var3 != (_Hash_node_base *)0x0) &&
                  (uVar12 = *(uint *)&p_Var3[1]._M_nxt,
                  (ulong)uVar12 % local_2d8.matrix_.matrix_._M_h._M_bucket_count == uVar11));
        }
        std::__throw_out_of_range("_Map_base::at");
      }
      p_Var3 = p_Var3->_M_nxt;
    } while ((p_Var3 != (_Hash_node_base *)0x0) &&
            (uVar12 = *(uint *)&p_Var3[1]._M_nxt,
            (ulong)uVar12 % local_2d8.matrix_.matrix_._M_h._M_bucket_count == uVar11));
  }
  std::__throw_out_of_range("_Map_base::at");
}

Assistant:

void test_column_removal() {
  auto columns = build_simple_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  test_content_equality(columns, m);

  m.remove_column(2);
  m.remove_column(4);
  BOOST_CHECK_THROW(m.get_column(2), std::logic_error);
  BOOST_CHECK_THROW(m.get_column(4), std::logic_error);

  columns.erase(columns.begin() + 4);
  columns.erase(columns.begin() + 2);
  unsigned int i = 0;
  for (auto& b : columns) {
    if (i == 2 || i == 4) ++i;
    test_column_equality<typename Matrix::Column>(b, get_column_content_via_iterators(m.get_column(i++)));
  }

  if constexpr (!Matrix::Option_list::has_row_access) {
    m.insert_column(witness_content<typename Matrix::Column>{}, 2);
    BOOST_CHECK_NO_THROW(m.get_column(2));
    BOOST_CHECK_THROW(m.get_column(4), std::logic_error);
  }
}